

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O2

void __thiscall Engine::saveCurrentSolution(Engine *this)

{
  uint uVar1;
  IntVar **ppIVar2;
  IntVar *pIVar3;
  uint i;
  ulong uVar4;
  
  SAT::saveCurrentPolarities(&sat);
  uVar1 = (this->vars).sz;
  ppIVar2 = (this->vars).data;
  for (uVar4 = 0; uVar4 < uVar1; uVar4 = uVar4 + 1) {
    pIVar3 = ppIVar2[uVar4];
    pIVar3->last_solution_value = (pIVar3->min).v;
    if (pIVar3->sbps_value_selection == false) {
      pIVar3->sbps_value_selection = true;
    }
  }
  return;
}

Assistant:

void Engine::saveCurrentSolution() {
	sat.saveCurrentPolarities();                      // SAT vars
	for (unsigned int i = 0; i < vars.size(); i++) {  // Int vars
		vars[i]->saveCurrentValue();
	}
}